

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O3

void __thiscall AppParametersTest_precedent_Test::TestBody(AppParametersTest_precedent_Test *this)

{
  unique_ptr<const_wchar_t_*[],_std::default_delete<const_wchar_t_*[]>_> uVar1;
  unique_ptr<const_wchar_t_*[],_std::default_delete<const_wchar_t_*[]>_> uVar2;
  char cVar3;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *lhs;
  pointer *__ptr;
  char *pcVar4;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar5;
  long *local_208;
  undefined1 local_200 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  undefined1 local_1f0 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e8;
  long local_1e0 [5];
  AssertHelper local_1b8 [8];
  ArgWrapper<wchar_t> args;
  ArgWrapper<wchar_t> envs;
  app_parameters parameters;
  
  ArgWrapper<wchar_t>::
  ArgWrapper<wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*,wchar_t_const*>
            (&args,L"/path/to/exe",L"some",L"words",L"--switch",L"-key",L"value",L"--",L"-other_key"
             ,L"value");
  ArgWrapper<wchar_t>::ArgWrapper<wchar_t_const*,wchar_t_const*>
            (&envs,L"key=other_value",L"other_key=some_value");
  uVar2 = envs.m_argv;
  uVar1 = args.m_argv;
  jessilib::app_parameters::default_stop_args();
  jessilib::app_parameters::app_parameters
            (&parameters,
             (int)((ulong)((long)args.m_args.
                                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)args.m_args.
                                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5),
             (wchar_t **)
             uVar1._M_t.
             super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
             super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl,
             (wchar_t **)
             uVar2._M_t.
             super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
             super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
             super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl,(unordered_set *)local_1f0)
  ;
  std::
  _Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::allocator<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::hash<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_1f0);
  lhs = (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
        jessilib::app_parameters::precedent_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[11]>
            ((internal *)local_1f0,"parameters.precedent()","u8\"some words\"",lhs,
             (char8_t (*) [11])"some words");
  if (local_1f0[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_1e8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1e8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x160,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_200 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_1e8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8._M_head_impl);
  }
  cVar3 = jessilib::app_parameters::has_switch(&parameters,6,"switch");
  local_200[0] = cVar3;
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_1f0,local_200,"parameters.has_switch(u8\"switch\")","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x161,(char *)CONCAT71(local_1f0._1_7_,local_1f0[0]));
    testing::internal::AssertHelper::operator=(local_1b8,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    if ((long *)CONCAT71(local_1f0._1_7_,local_1f0[0]) != local_1e0) {
      operator_delete((long *)CONCAT71(local_1f0._1_7_,local_1f0[0]),local_1e0[0] + 1);
    }
    if (local_208 != (long *)0x0) {
      (**(code **)(*local_208 + 8))();
    }
    if (local_1f8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1f8,local_1f8);
    }
  }
  _local_200 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
               jessilib::app_parameters::get_arg_value(&parameters,3,"key",0,0);
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[6]>
            ((internal *)local_1f0,"parameters.get_arg_value(u8\"key\")","u8\"value\"",
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_200,
             (char8_t (*) [6])0x46cadb);
  if (local_1f0[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_1e8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1e8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x162,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_200 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_1e8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8._M_head_impl);
  }
  bVar5 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
          jessilib::app_parameters::get_env_value(&parameters,3,"key",0,0);
  _local_200 = bVar5;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[12]>
            ((internal *)local_1f0,"parameters.get_env_value(u8\"key\")","u8\"other_value\"",
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_200,
             (char8_t (*) [12])"other_value");
  if (local_1f0[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_200);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1e8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x163,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_200 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  if (local_1e8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8._M_head_impl);
  }
  bVar5 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
          jessilib::app_parameters::get_value(&parameters,3,"key",0,0);
  _local_200 = bVar5;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[6]>
            ((internal *)local_1f0,"parameters.get_value(u8\"key\")","u8\"value\"",
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_200,
             (char8_t (*) [6])0x46cadb);
  if (local_1f0[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_200);
    if (local_1e8._M_head_impl ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1e8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x164,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_200 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_1e8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8._M_head_impl);
  }
  bVar5 = (basic_string_view<char8_t,_std::char_traits<char8_t>_>)
          jessilib::app_parameters::get_value(&parameters,9,"other_key",0,0);
  _local_200 = bVar5;
  testing::internal::
  CmpHelperEQ<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t[11]>
            ((internal *)local_1f0,"parameters.get_value(u8\"other_key\")","u8\"some_value\"",
             (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_200,
             (char8_t (*) [11])"some_value");
  if (local_1f0[0] == (unordered_set)0x0) {
    testing::Message::Message((Message *)local_200);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_1e8._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_1e8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/app_parameters.cpp"
               ,0x165,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_200 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_200 + 8))();
    }
  }
  if (local_1e8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e8,local_1e8._M_head_impl);
  }
  jessilib::app_parameters::~app_parameters(&parameters);
  if ((__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)
      envs.m_argv._M_t.
      super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
      super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)0x0) {
    operator_delete__((void *)envs.m_argv._M_t.
                              super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>
                              .super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl);
  }
  envs.m_argv._M_t.super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>.
  _M_t.super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
  super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>,_true,_true>)
       (__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&envs.m_args);
  if ((__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)
      args.m_argv._M_t.
      super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
      super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
      super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl !=
      (__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)0x0) {
    operator_delete__((void *)args.m_argv._M_t.
                              super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>
                              .super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl);
  }
  args.m_argv._M_t.super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>.
  _M_t.super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
  super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl =
       (__uniq_ptr_data<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>,_true,_true>)
       (__uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>)0x0;
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&args.m_args);
  return;
}

Assistant:

TEST(AppParametersTest, precedent) {
	ArgWrapper<wchar_t> args{ L"/path/to/exe", L"some", L"words", L"--switch", L"-key", L"value", L"--", L"-other_key", L"value" };
	ArgWrapper<wchar_t> envs{ L"key=other_value", L"other_key=some_value" };
	app_parameters parameters{ args.argc(), args.argv(), envs.argv() };

	EXPECT_EQ(parameters.precedent(), u8"some words");
	EXPECT_TRUE(parameters.has_switch(u8"switch"));
	EXPECT_EQ(parameters.get_arg_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_env_value(u8"key"), u8"other_value");
	EXPECT_EQ(parameters.get_value(u8"key"), u8"value");
	EXPECT_EQ(parameters.get_value(u8"other_key"), u8"some_value");
}